

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_cursor.c
# Opt level: O3

void ts_tree_cursor_init(TreeCursor *self,TSNode node)

{
  uint32_t uVar1;
  TSPoint TVar2;
  TreeCursorEntry *__ptr;
  uint uVar3;
  TreeCursorEntry *unaff_RBX;
  TreeCursorEntry *pTVar4;
  
  do {
    *(TreeCursorEntry **)((long)register0x00000020 + -8) = unaff_RBX;
    ((TreeCursorEntry *)self)->subtree = *(Subtree **)((long)register0x00000020 + 0x20);
    ((anon_struct_16_3_8b926706_for_stack *)&((TreeCursorEntry *)self)->position)->size = 0;
    uVar3 = 0;
    __ptr = ((anon_struct_16_3_8b926706_for_stack *)&((TreeCursorEntry *)self)->position)->contents;
    if (((TreeCursorEntry *)self)->child_index != 0) {
LAB_00134add:
      (((TreeCursorEntry *)self)->position).extent.column = uVar3 + 1;
      uVar1 = *(uint32_t *)((long)register0x00000020 + 8);
      TVar2 = *(TSPoint *)((long)register0x00000020 + 0xc);
      __ptr[uVar3].subtree = *(Subtree **)((long)register0x00000020 + 0x18);
      __ptr[uVar3].position.bytes = uVar1;
      __ptr[uVar3].position.extent = TVar2;
      __ptr[uVar3].child_index = 0;
      __ptr[uVar3].structural_child_index = 0;
      return;
    }
    if (__ptr == (TreeCursorEntry *)0x0) {
      pTVar4 = (TreeCursorEntry *)&DAT_00000008;
      *(undefined8 *)((long)register0x00000020 + -0x10) = 0x134acb;
      __ptr = (TreeCursorEntry *)calloc(8,0x20);
      if (__ptr == (TreeCursorEntry *)0x0) goto LAB_00134b15;
      uVar3 = 0;
LAB_00134ad2:
      *(TreeCursorEntry **)&(((TreeCursorEntry *)self)->position).bytes = __ptr;
      ((TreeCursorEntry *)self)->child_index = 8;
      goto LAB_00134add;
    }
    *(undefined8 *)((long)register0x00000020 + -0x10) = 0x134ab2;
    pTVar4 = __ptr;
    __ptr = (TreeCursorEntry *)realloc(__ptr,0x100);
    if (__ptr != (TreeCursorEntry *)0x0) {
      uVar3 = (((TreeCursorEntry *)self)->position).extent.column;
      goto LAB_00134ad2;
    }
    *(undefined8 *)((long)register0x00000020 + -0x10) = 0x134b15;
    ts_tree_cursor_init_cold_1();
LAB_00134b15:
    *(code **)((long)register0x00000020 + -0x10) = ts_tree_cursor_reset;
    ts_tree_cursor_init_cold_2();
    unaff_RBX = (TreeCursorEntry *)self;
    register0x00000020 = (BADSPACEBASE *)((long)register0x00000020 + -8);
    self = (TreeCursor *)pTVar4;
  } while( true );
}

Assistant:

void ts_tree_cursor_init(TreeCursor *self, TSNode node) {
  self->tree = node.tree;
  array_clear(&self->stack);
  array_push(&self->stack, ((TreeCursorEntry) {
    .subtree = (const Subtree *)node.id,
    .position = {
      ts_node_start_byte(node),
      ts_node_start_point(node)
    },
    .child_index = 0,
    .structural_child_index = 0,
  }));
}